

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test::
testBody(TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test
         *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  undefined1 local_60 [8];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test
  *this_local;
  
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer =
       (StringBufferTestOutput *)anon_var_dwarf_66e4;
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60,2,
             (char **)&commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  CommandLineTestRunner::runAllTestsMain((CommandLineTestRunner *)local_60);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = TestRegistry::countPlugins
                    (&(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,(long)iVar1,"LONGS_EQUAL(0, registry.countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0x8c,pTVar3);
  CommandLineTestRunnerWithStringBufferOutput::~CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60);
  return;
}

Assistant:

TEST(CommandLineTestRunner, NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid)
{
    const char* argv[] = { "tests.exe", "-fdskjnfkds"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    LONGS_EQUAL(0, registry.countPlugins());

}